

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  MemoryStream *pMVar1;
  byte *pbVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  byte *pbVar9;
  byte *pbVar10;
  char *pcVar11;
  int iVar12;
  char *pcVar13;
  ulong uVar14;
  ulong i;
  bool bVar15;
  int iVar16;
  int iVar17;
  uint i_00;
  double d;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double local_68;
  NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
  s;
  
  lVar8 = (long)is->is_->src_ - (long)is->is_->begin_;
  s.is = is;
  bVar5 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,false,false>>
                    (&s,'-');
  pMVar1 = (s.is)->is_;
  pbVar10 = (byte *)pMVar1->src_;
  pbVar2 = (byte *)pMVar1->end_;
  if (pbVar10 == pbVar2) {
LAB_00126db1:
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                    ,0x602,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar8 = (long)pbVar10 - (long)pMVar1->begin_;
    *(undefined4 *)(this + 0x30) = 3;
    goto LAB_00126d1f;
  }
  if (*pbVar10 == 0x30) {
    pMVar1->src_ = (Ch *)(pbVar10 + 1);
    local_68 = 0.0;
    bVar7 = false;
    i = 0;
    iVar17 = 0;
    bVar15 = false;
    bVar4 = false;
    i_00 = 0;
  }
  else {
    if (8 < (byte)(*pbVar10 - 0x31)) goto LAB_00126db1;
    pbVar9 = pbVar10 + 1;
    pMVar1->src_ = (Ch *)pbVar9;
    i_00 = (int)(char)*pbVar10 - 0x30;
    iVar16 = (int)pbVar2 - (int)pbVar9;
    iVar12 = 0;
    if (bVar5) {
LAB_001267c7:
      iVar17 = iVar16;
      if ((pbVar9 == pbVar2) || (iVar17 = iVar12, 9 < (byte)(*pbVar9 - 0x30))) goto LAB_0012690e;
      if (i_00 < 0xccccccc) {
LAB_001267ea:
        pMVar1->src_ = (Ch *)(pbVar9 + 1);
        i_00 = (i_00 * 10 + (int)(char)*pbVar9) - 0x30;
        iVar12 = iVar12 + 1;
        pbVar9 = pbVar9 + 1;
        goto LAB_001267c7;
      }
      if (i_00 != 0xccccccc) goto LAB_00126867;
      if (*pbVar9 != 0x39) goto LAB_001267ea;
      i_00 = 0xccccccc;
LAB_00126867:
      uVar14 = (ulong)i_00;
      iVar16 = ((int)pbVar2 + iVar12) - (int)pbVar9;
      if (bVar5) {
        while ((i = uVar14, iVar17 = iVar16, pbVar9 != pbVar2 &&
               (iVar17 = iVar12, (byte)(*pbVar9 - 0x30) < 10))) {
          if ((0xccccccccccccccb < uVar14) &&
             ((uVar14 != 0xccccccccccccccc || (i = 0xccccccccccccccc, *pbVar9 == 0x39))))
          goto LAB_0012697f;
          pMVar1->src_ = (Ch *)(pbVar9 + 1);
          uVar14 = (ulong)((int)(char)*pbVar9 - 0x30) + uVar14 * 10;
          iVar12 = iVar12 + 1;
          pbVar9 = pbVar9 + 1;
        }
      }
      else {
        while ((i = uVar14, iVar17 = iVar16, pbVar9 != pbVar2 &&
               (iVar17 = iVar12, (byte)(*pbVar9 - 0x30) < 10))) {
          if ((0x1999999999999998 < uVar14) &&
             ((uVar14 != 0x1999999999999999 || (i = 0x1999999999999999, 0x35 < *pbVar9))))
          goto LAB_0012697f;
          pMVar1->src_ = (Ch *)(pbVar9 + 1);
          uVar14 = (ulong)((int)(char)*pbVar9 - 0x30) + uVar14 * 10;
          iVar12 = iVar12 + 1;
          pbVar9 = pbVar9 + 1;
        }
      }
      local_68 = 0.0;
      bVar7 = false;
      bVar4 = true;
      bVar15 = false;
    }
    else {
      while ((iVar17 = iVar16, pbVar9 != pbVar2 && (iVar17 = iVar12, (byte)(*pbVar9 - 0x30) < 10)))
      {
        if (0x19999998 < i_00) {
          if (i_00 != 0x19999999) goto LAB_00126867;
          if (0x35 < *pbVar9) {
            i_00 = 0x19999999;
            goto LAB_00126867;
          }
        }
        pMVar1->src_ = (Ch *)(pbVar9 + 1);
        i_00 = (i_00 * 10 + (int)(char)*pbVar9) - 0x30;
        iVar12 = iVar12 + 1;
        pbVar9 = pbVar9 + 1;
      }
LAB_0012690e:
      local_68 = 0.0;
      bVar7 = false;
      i = 0;
      bVar15 = false;
      bVar4 = false;
    }
  }
  goto LAB_00126a23;
LAB_0012697f:
  auVar18._8_4_ = (int)(i >> 0x20);
  auVar18._0_8_ = i;
  auVar18._12_4_ = 0x45300000;
  local_68 = (auVar18._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  while ((pbVar9 != pbVar2 && ((byte)(*pbVar9 - 0x30) < 10))) {
    pMVar1->src_ = (Ch *)(pbVar9 + 1);
    local_68 = local_68 * 10.0 + (double)((char)*pbVar9 + -0x30);
    pbVar9 = pbVar9 + 1;
  }
  bVar7 = true;
  bVar15 = true;
  bVar4 = true;
LAB_00126a23:
  bVar6 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,false,false>>
                    (&s,'.');
  iVar12 = 0;
  if (bVar6) {
    pMVar1 = (s.is)->is_;
    pbVar10 = (byte *)pMVar1->src_;
    pbVar2 = (byte *)pMVar1->end_;
    if ((pbVar10 == pbVar2) || ((byte)(*pbVar10 - 0x3a) < 0xf6)) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x62d,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      lVar8 = (long)pbVar10 - (long)pMVar1->begin_;
      *(undefined4 *)(this + 0x30) = 0xe;
      goto LAB_00126d1f;
    }
    iVar12 = 0;
    if (!bVar7) {
      if (!bVar4) {
        i = (ulong)i_00;
      }
      iVar16 = 0;
      pbVar9 = pbVar10;
      while ((((iVar12 = (int)pbVar10 - (int)pbVar2, pbVar9 != pbVar2 &&
               (iVar12 = iVar16, '/' < (char)*pbVar9)) && (*pbVar9 < 0x3a)) && (i >> 0x35 == 0))) {
        pMVar1->src_ = (Ch *)(pbVar9 + 1);
        iVar16 = iVar16 + -1;
        i = (ulong)((int)(char)*pbVar9 - 0x30) + i * 10;
        iVar17 = iVar17 + (uint)(i != 0);
        pbVar9 = pbVar9 + 1;
      }
      auVar19._8_4_ = (int)(i >> 0x20);
      auVar19._0_8_ = i;
      auVar19._12_4_ = 0x45300000;
      local_68 = (auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
      bVar15 = true;
      pbVar10 = pbVar9;
    }
    while ((pbVar9 = pbVar10, pbVar9 != pbVar2 && ((byte)(*pbVar9 - 0x30) < 10))) {
      pbVar10 = pbVar9 + 1;
      pMVar1->src_ = (Ch *)pbVar10;
      if (iVar17 < 0x11) {
        local_68 = local_68 * 10.0 + (double)((char)*pbVar9 + -0x30);
        iVar12 = iVar12 + -1;
        if (0.0 < local_68) {
          iVar17 = iVar17 + 1;
        }
      }
    }
  }
  bVar7 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,false,false>>
                    (&s,'e');
  if (bVar7) {
LAB_00126b7a:
    uVar14 = (ulong)i_00;
    if (bVar4) {
      uVar14 = i;
    }
    if (!bVar15) {
      auVar20._8_4_ = (int)(uVar14 >> 0x20);
      auVar20._0_8_ = uVar14;
      auVar20._12_4_ = 0x45300000;
      local_68 = (auVar20._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0);
      bVar15 = true;
    }
    bVar7 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,false,false>>
                      (&s,'+');
    if (bVar7) {
      bVar7 = false;
    }
    else {
      bVar7 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,false,false>>
                        (&s,'-');
    }
    pMVar1 = (s.is)->is_;
    pcVar11 = pMVar1->src_;
    pcVar3 = pMVar1->end_;
    if ((pcVar11 == pcVar3) || (9 < (byte)(*pcVar11 - 0x30U))) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x682,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      lVar8 = (long)pcVar11 - (long)pMVar1->begin_;
      *(undefined4 *)(this + 0x30) = 0xf;
      goto LAB_00126d1f;
    }
    pcVar13 = pcVar11 + 1;
    pMVar1->src_ = pcVar13;
    iVar16 = *pcVar11 + -0x30;
    if (bVar7 == false) {
      do {
        if ((pcVar13 == pcVar3) || (9 < (byte)(*pcVar13 - 0x30U))) goto LAB_00126cda;
        pMVar1->src_ = pcVar13 + 1;
        iVar16 = (int)*pcVar13 + iVar16 * 10 + -0x30;
        pcVar13 = pcVar13 + 1;
      } while (iVar16 <= 0x134 - iVar12);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x67d,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      goto LAB_00126d1f;
    }
    if (0 < iVar12) {
      __assert_fail("expFrac <= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                    ,0x66d,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    while ((pcVar13 != pcVar3 && ((byte)(*pcVar13 - 0x30U) < 10))) {
      pcVar11 = pcVar13 + 1;
      pMVar1->src_ = pcVar11;
      iVar16 = iVar16 * 10 + (int)*pcVar13 + -0x30;
      pcVar13 = pcVar11;
      if ((iVar12 + 0x7ffffff7) / 10 < iVar16) {
        while ((pcVar13 = pcVar11, pcVar11 != pcVar3 && ((byte)(*pcVar11 - 0x30U) < 10))) {
          pcVar11 = pcVar11 + 1;
          pMVar1->src_ = pcVar11;
        }
      }
    }
LAB_00126cda:
    iVar17 = -iVar16;
    if (bVar7 == false) {
      iVar17 = iVar16;
    }
  }
  else {
    bVar7 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,false,false>>
                      (&s,'E');
    iVar17 = 0;
    if (bVar7) goto LAB_00126b7a;
  }
  if (bVar15) {
    d = internal::StrtodNormalPrecision(local_68,iVar17 + iVar12);
    if (1.79769313486232e+308 < d) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x6b1,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      goto LAB_00126d1f;
    }
    if (bVar5) {
      d = -d;
    }
    bVar5 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Double(handler,d);
  }
  else if (bVar4) {
    if (bVar5) {
      bVar5 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Int64(handler,-i);
    }
    else {
      bVar5 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Uint64(handler,i);
    }
  }
  else if (bVar5) {
    bVar5 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Int(handler,-i_00);
  }
  else {
    bVar5 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Uint(handler,i_00);
  }
  if (bVar5 != false) {
    return;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                  ,0x6c9,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  *(undefined4 *)(this + 0x30) = 0x10;
LAB_00126d1f:
  *(long *)(this + 0x38) = lVar8;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }

            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    // (exp + expFrac) must not underflow int => we're detecting when -exp gets
                    // dangerously close to INT_MIN (a pessimistic next digit 9 would push it into
                    // underflow territory):
                    //
                    //        -(exp * 10 + 9) + expFrac >= INT_MIN
                    //   <=>  exp <= (expFrac - INT_MIN - 9) / 10
                    RAPIDJSON_ASSERT(expFrac <= 0);
                    int maxExp = (expFrac + 2147483639) / 10;

                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp)) {
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               // Use > max, instead of == inf, to fix bogus warning -Wfloat-equal
               if (d > (std::numeric_limits<double>::max)()) {
                   // Overflow
                   // TODO: internal::StrtodX should report overflow (or underflow)
                   RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
               }

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }